

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.c
# Opt level: O1

char * blob_read_string(blob_reader *blob)

{
  uint8_t *puVar1;
  uint8_t *__s;
  void *pvVar2;
  ulong uVar3;
  
  puVar1 = blob->end;
  __s = blob->current;
  if (__s < puVar1) {
    pvVar2 = memchr(__s,0,(long)puVar1 - (long)__s);
    if (pvVar2 != (void *)0x0) {
      if (blob->overrun == false) {
        if ((__s <= puVar1) &&
           (uVar3 = (ulong)(((int)pvVar2 - (int)__s) + 1),
           uVar3 <= (ulong)((long)puVar1 - (long)__s))) {
          blob->current = __s + uVar3;
          return (char *)__s;
        }
        blob->overrun = true;
      }
      __assert_fail("ensure_can_read(blob, size)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/util/blob.c"
                    ,0x169,"char *blob_read_string(struct blob_reader *)");
    }
  }
  blob->overrun = true;
  return (char *)0x0;
}

Assistant:

char *
blob_read_string(struct blob_reader *blob)
{
   int size;
   char *ret;
   uint8_t *nul;

   /* If we're already at the end, then this is an overrun. */
   if (blob->current >= blob->end) {
      blob->overrun = true;
      return NULL;
   }

   /* Similarly, if there is no zero byte in the data remaining in this blob,
    * we also consider that an overrun.
    */
   nul = memchr(blob->current, 0, blob->end - blob->current);

   if (nul == NULL) {
      blob->overrun = true;
      return NULL;
   }

   size = nul - blob->current + 1;

   assert(ensure_can_read(blob, size));

   ret = (char *) blob->current;

   blob->current += size;

   return ret;
}